

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,string *settingsFileName,string *fallbackSettingsFileName)

{
  bool bVar1;
  cmLocalGenerator *__p;
  ostream *poVar2;
  char *pcVar3;
  ulong uVar4;
  undefined1 local_1750 [8];
  RegularExpression currentRegex;
  string *currentRegexString;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  string local_1640;
  char *local_1620;
  char *value_12;
  string ignoreTargetsRegexes;
  string local_15f0;
  allocator<char> local_15c9;
  string local_15c8;
  char *local_15a8;
  char *value_11;
  string local_1598;
  allocator<char> local_1571;
  string local_1570;
  char *local_1550;
  char *value_10;
  string local_1540;
  allocator<char> local_1519;
  string local_1518;
  char *local_14f8;
  char *value_9;
  string local_14e8;
  allocator<char> local_14c1;
  string local_14c0;
  char *local_14a0;
  char *value_8;
  string local_1490;
  allocator<char> local_1469;
  string local_1468;
  char *local_1448;
  char *value_7;
  string local_1438;
  allocator<char> local_1411;
  string local_1410;
  char *local_13f0;
  char *value_6;
  string local_13e0;
  allocator<char> local_13b9;
  string local_13b8;
  char *local_1398;
  char *value_5;
  string local_1388;
  allocator<char> local_1361;
  string local_1360;
  char *local_1340;
  char *value_4;
  string local_1330;
  char *local_1310;
  char *value_3;
  string local_1300;
  char *local_12e0;
  char *value_2;
  string local_12d0;
  char *local_12b0;
  char *value_1;
  string local_12a0;
  char *local_1280;
  char *value;
  undefined4 local_1254;
  undefined1 local_1250 [8];
  string inFileName;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> lg;
  undefined1 local_1210 [8];
  cmMakefile mf;
  cmGlobalGenerator ggi;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3c9;
  string local_3c8;
  undefined1 local_3a8 [8];
  cmake cm;
  string *fallbackSettingsFileName_local;
  string *settingsFileName_local;
  cmGraphVizWriter *this_local;
  
  cm._896_8_ = fallbackSettingsFileName;
  cmake::cmake((cmake *)local_3a8,RoleScript,Unknown);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"",&local_3c9);
  cmake::SetHomeDirectory((cmake *)local_3a8,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"",&local_401);
  cmake::SetHomeOutputDirectory((cmake *)local_3a8,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&ggi.InstallTargetEnabled,(cmake *)local_3a8);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&ggi.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_3a8);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&lg,(cmake *)local_3a8);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_1210,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,
             (cmStateSnapshot *)&lg);
  __p = cmGlobalGenerator::CreateLocalGenerator
                  ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmMakefile *)local_1210);
  std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>::
  unique_ptr<std::default_delete<cmLocalGenerator>,void>
            ((unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>> *)
             (inFileName.field_2._M_local_buf + 8),__p);
  std::__cxx11::string::string((string *)local_1250,(string *)settingsFileName);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_1250);
  if (!bVar1) {
    std::__cxx11::string::operator=((string *)local_1250,(string *)cm._896_8_);
    bVar1 = cmsys::SystemTools::FileExists((string *)local_1250);
    if (!bVar1) {
      local_1254 = 1;
      goto LAB_005dacff;
    }
  }
  bVar1 = cmMakefile::ReadListFile((cmMakefile *)local_1210,(string *)local_1250);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
    poVar2 = std::operator<<(poVar2,(string *)local_1250);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12a0,"GRAPHVIZ_GRAPH_TYPE",(allocator<char> *)((long)&value_1 + 7));
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_12a0);
    std::__cxx11::string::~string((string *)&local_12a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_1 + 7));
    local_1280 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)this,pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12d0,"GRAPHVIZ_GRAPH_NAME",(allocator<char> *)((long)&value_2 + 7));
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_12d0);
    std::__cxx11::string::~string((string *)&local_12d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_2 + 7));
    local_12b0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphName,pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1300,"GRAPHVIZ_GRAPH_HEADER",(allocator<char> *)((long)&value_3 + 7)
              );
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_1300);
    std::__cxx11::string::~string((string *)&local_1300);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_3 + 7));
    local_12e0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphHeader,pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1330,"GRAPHVIZ_NODE_PREFIX",(allocator<char> *)((long)&value_4 + 7))
    ;
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_1330);
    std::__cxx11::string::~string((string *)&local_1330);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_4 + 7));
    local_1310 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphNodePrefix,pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1360,"GRAPHVIZ_EXECUTABLES",&local_1361);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_1360);
    std::__cxx11::string::~string((string *)&local_1360);
    std::allocator<char>::~allocator(&local_1361);
    local_1340 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1388,"GRAPHVIZ_EXECUTABLES",
                 (allocator<char> *)((long)&value_5 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_1210,&local_1388);
      this->GenerateForExecutables = bVar1;
      std::__cxx11::string::~string((string *)&local_1388);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_5 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13b8,"GRAPHVIZ_STATIC_LIBS",&local_13b9);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_13b8);
    std::__cxx11::string::~string((string *)&local_13b8);
    std::allocator<char>::~allocator(&local_13b9);
    local_1398 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_13e0,"GRAPHVIZ_STATIC_LIBS",
                 (allocator<char> *)((long)&value_6 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_1210,&local_13e0);
      this->GenerateForStaticLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_13e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_6 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1410,"GRAPHVIZ_SHARED_LIBS",&local_1411);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_1410);
    std::__cxx11::string::~string((string *)&local_1410);
    std::allocator<char>::~allocator(&local_1411);
    local_13f0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1438,"GRAPHVIZ_SHARED_LIBS",
                 (allocator<char> *)((long)&value_7 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_1210,&local_1438);
      this->GenerateForSharedLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_1438);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_7 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1468,"GRAPHVIZ_MODULE_LIBS",&local_1469);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_1468);
    std::__cxx11::string::~string((string *)&local_1468);
    std::allocator<char>::~allocator(&local_1469);
    local_1448 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1490,"GRAPHVIZ_MODULE_LIBS",
                 (allocator<char> *)((long)&value_8 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_1210,&local_1490);
      this->GenerateForModuleLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_1490);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_8 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14c0,"GRAPHVIZ_INTERFACE",&local_14c1);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_14c0);
    std::__cxx11::string::~string((string *)&local_14c0);
    std::allocator<char>::~allocator(&local_14c1);
    local_14a0 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_14e8,"GRAPHVIZ_INTERFACE",(allocator<char> *)((long)&value_9 + 7))
      ;
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_1210,&local_14e8);
      this->GenerateForInterface = bVar1;
      std::__cxx11::string::~string((string *)&local_14e8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_9 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1518,"GRAPHVIZ_EXTERNAL_LIBS",&local_1519);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_1518);
    std::__cxx11::string::~string((string *)&local_1518);
    std::allocator<char>::~allocator(&local_1519);
    local_14f8 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1540,"GRAPHVIZ_EXTERNAL_LIBS",
                 (allocator<char> *)((long)&value_10 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_1210,&local_1540);
      this->GenerateForExternals = bVar1;
      std::__cxx11::string::~string((string *)&local_1540);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_10 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1570,"GRAPHVIZ_GENERATE_PER_TARGET",&local_1571);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_1570);
    std::__cxx11::string::~string((string *)&local_1570);
    std::allocator<char>::~allocator(&local_1571);
    local_1550 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1598,"GRAPHVIZ_GENERATE_PER_TARGET",
                 (allocator<char> *)((long)&value_11 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_1210,&local_1598);
      this->GeneratePerTarget = bVar1;
      std::__cxx11::string::~string((string *)&local_1598);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_11 + 7));
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15c8,"GRAPHVIZ_GENERATE_DEPENDERS",&local_15c9);
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_15c8);
    std::__cxx11::string::~string((string *)&local_15c8);
    std::allocator<char>::~allocator(&local_15c9);
    local_15a8 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_15f0,"GRAPHVIZ_GENERATE_DEPENDERS",
                 (allocator<char> *)(ignoreTargetsRegexes.field_2._M_local_buf + 0xf));
      bVar1 = cmMakefile::IsOn((cmMakefile *)local_1210,&local_15f0);
      this->GenerateDependers = bVar1;
      std::__cxx11::string::~string((string *)&local_15f0);
      std::allocator<char>::~allocator
                ((allocator<char> *)(ignoreTargetsRegexes.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::string((string *)&value_12);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1640,"GRAPHVIZ_IGNORE_TARGETS",
               (allocator<char> *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar3 = cmMakefile::GetDefinition((cmMakefile *)local_1210,&local_1640);
    std::__cxx11::string::~string((string *)&local_1640);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_1620 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&value_12,pcVar3);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2);
      cmSystemTools::ExpandListArgument
                ((string *)&value_12,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,false);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2);
      currentRegexString =
           (string *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&currentRegexString), bVar1) {
        currentRegex._200_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
        cmsys::RegularExpression::RegularExpression((RegularExpression *)local_1750);
        bVar1 = cmsys::RegularExpression::compile
                          ((RegularExpression *)local_1750,(string *)currentRegex._200_8_);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
          poVar2 = std::operator<<(poVar2,(string *)currentRegex._200_8_);
          poVar2 = std::operator<<(poVar2,"\"");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                  (&this->TargetsToIgnoreRegex,(value_type *)local_1750);
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_1750);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
    }
    std::__cxx11::string::~string((string *)&value_12);
    local_1254 = 0;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   "Problem opening GraphViz options file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1250);
    cmSystemTools::Error((string *)&value);
    std::__cxx11::string::~string((string *)&value);
    local_1254 = 1;
  }
LAB_005dacff:
  std::__cxx11::string::~string((string *)local_1250);
  std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::~unique_ptr
            ((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
             ((long)&inFileName.field_2 + 8));
  cmMakefile::~cmMakefile((cmMakefile *)local_1210);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_3a8);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(
  const std::string& settingsFileName,
  const std::string& fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript, cmState::Unknown);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmMakefile mf(&ggi, cm.GetCurrentSnapshot());
  std::unique_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(&mf));

  std::string inFileName = settingsFileName;
  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf.ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: " +
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition)                                    \
  do {                                                                        \
    const char* value = mf.GetDefinition(cmakeDefinition);                    \
    if (value) {                                                              \
      (var) = value;                                                          \
    }                                                                         \
  } while (false)

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition)                               \
  do {                                                                        \
    const char* value = mf.GetDefinition(cmakeDefinition);                    \
    if (value) {                                                              \
      (var) = mf.IsOn(cmakeDefinition);                                       \
    }                                                                         \
  } while (false)

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForInterface, "GRAPHVIZ_INTERFACE");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for (std::string const& currentRegexString : ignoreTargetsRegExVector) {
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString)) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(std::move(currentRegex));
    }
  }
}